

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::EmitSnapType(SnapType *sType,FileWriter *writer,Separator separator)

{
  TTD_PTR_ID local_30;
  TTD_PTR_ID handlerId;
  Separator separator_local;
  FileWriter *writer_local;
  SnapType *sType_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteAddr(writer,typeId,sType->TypePtrId,NoSeparator);
  FileWriter::WriteTag<Js::TypeId>(writer,jsTypeId,sType->JsTypeId,CommaSeparator);
  FileWriter::WriteLogTag(writer,ctxTag,sType->ScriptContextLogId,CommaSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x29,1);
  NSSnapValues::EmitTTDVar(sType->PrototypeVar,writer,NoSeparator);
  if (sType->TypeHandlerInfo == (SnapHandler *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = sType->TypeHandlerInfo->HandlerId;
  }
  FileWriter::WriteAddr(writer,handlerId,local_30,CommaSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(sType->HasNoEnumerableProperties & 1),1);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapType(const SnapType* sType, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::typeId, sType->TypePtrId);

            writer->WriteTag<Js::TypeId>(NSTokens::Key::jsTypeId, sType->JsTypeId, NSTokens::Separator::CommaSeparator);
            writer->WriteLogTag(NSTokens::Key::ctxTag, sType->ScriptContextLogId, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::prototypeVar, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(sType->PrototypeVar, writer, NSTokens::Separator::NoSeparator);

            TTD_PTR_ID handlerId = (sType->TypeHandlerInfo != nullptr) ? sType->TypeHandlerInfo->HandlerId : TTD_INVALID_PTR_ID;
            writer->WriteAddr(NSTokens::Key::handlerId, handlerId, NSTokens::Separator::CommaSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, sType->HasNoEnumerableProperties, NSTokens::Separator::CommaSeparator);

            writer->WriteRecordEnd();
        }